

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_shr_ins_vec(TCGContext_conflict1 *tcg_ctx,uint vece,TCGv_vec d,TCGv_vec a,int64_t sh)

{
  TCGv_vec r;
  TCGv_vec r_00;
  uintptr_t o_1;
  uintptr_t o;
  
  if (sh != 0) {
    r = tcg_temp_new_vec_matching_aarch64(tcg_ctx,d);
    r_00 = tcg_temp_new_vec_matching_aarch64(tcg_ctx,d);
    tcg_gen_dupi_vec_aarch64
              (tcg_ctx,vece,r_00,
               (0xffffffffffffffffU >> (-(char)sh & 0x3fU)) <<
               ((char)(8 << ((byte)vece & 0x1f)) - (char)sh & 0x3fU));
    tcg_gen_shri_vec_aarch64(tcg_ctx,vece,r,a,sh);
    tcg_gen_and_vec_aarch64(tcg_ctx,vece,d,d,r_00);
    tcg_gen_or_vec_aarch64(tcg_ctx,vece,d,d,r);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(r + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(r_00 + (long)tcg_ctx));
    return;
  }
  tcg_gen_mov_vec_aarch64(tcg_ctx,d,a);
  return;
}

Assistant:

static void gen_shr_ins_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec d, TCGv_vec a, int64_t sh)
{
    if (sh == 0) {
        tcg_gen_mov_vec(tcg_ctx, d, a);
    } else {
        TCGv_vec t = tcg_temp_new_vec_matching(tcg_ctx, d);
        TCGv_vec m = tcg_temp_new_vec_matching(tcg_ctx, d);

        tcg_gen_dupi_vec(tcg_ctx, vece, m, MAKE_64BIT_MASK((8 << vece) - sh, sh));
        tcg_gen_shri_vec(tcg_ctx, vece, t, a, sh);
        tcg_gen_and_vec(tcg_ctx, vece, d, d, m);
        tcg_gen_or_vec(tcg_ctx, vece, d, d, t);

        tcg_temp_free_vec(tcg_ctx, t);
        tcg_temp_free_vec(tcg_ctx, m);
    }
}